

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polling_util.hpp
# Opt level: O2

void __thiscall
zmq::fast_vector_t<pollfd,_16UL>::fast_vector_t(fast_vector_t<pollfd,_16UL> *this,size_t nitems_)

{
  pollfd *ppVar1;
  
  if (nitems_ < 0x11) {
    this->_buf = this->_static_buf;
  }
  else {
    ppVar1 = (pollfd *)malloc(nitems_ << 3);
    this->_buf = ppVar1;
    if (ppVar1 == (pollfd *)0x0) {
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/polling_util.hpp"
              ,0x33);
      fflush(_stderr);
      zmq_abort("FATAL ERROR: OUT OF MEMORY");
      return;
    }
  }
  return;
}

Assistant:

explicit fast_vector_t (const size_t nitems_)
    {
        if (nitems_ > S) {
            _buf = static_cast<T *> (malloc (nitems_ * sizeof (T)));
            //  TODO since this function is called by a client, we could return errno == ENOMEM here
            alloc_assert (_buf);
        } else {
            _buf = _static_buf;
        }
    }